

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool CLI::detail::split_windows_style(string *current,string *name,string *value)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (current->_M_string_length < 2) {
    return false;
  }
  pcVar1 = (current->_M_dataplus)._M_p;
  if ((*pcVar1 == '/') && (bVar2 = valid_first_char<char>(pcVar1[1]), bVar2)) {
    lVar3 = ::std::__cxx11::string::find((char)current,0x3a);
    if (lVar3 == -1) {
      ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
      ::std::__cxx11::string::operator=((string *)name,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      ::std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,0x141133);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
      ::std::__cxx11::string::operator=((string *)name,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
      ::std::__cxx11::string::operator=((string *)value,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
    }
    return true;
  }
  return false;
}

Assistant:

inline bool split_windows_style(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 1 && current[0] == '/' && valid_first_char(current[1])) {
        auto loc = current.find_first_of(':');
        if(loc != std::string::npos) {
            name = current.substr(1, loc - 1);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(1);
            value = "";
        }
        return true;
    }
    return false;
}